

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O3

void __thiscall
ut::
are_equal<agge::tests::(anonymous_namespace)::span,7ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
          (ut *this,span (*expected) [7],
          vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
          *actual,LocationInfo *location)

{
  long lVar1;
  FailedAssertion *pFVar2;
  string local_40;
  
  if ((long)actual - (long)expected != 0x70) {
    pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Values are not equal!","");
    FailedAssertion::FailedAssertion(pFVar2,&local_40,location);
    __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  lVar1 = 0;
  while ((((*(int *)(this + lVar1) == *(int *)((long)&(*expected)[0].y + lVar1) &&
           (*(int *)(this + lVar1 + 4) == *(int *)((long)&(*expected)[0].x + lVar1))) &&
          (*(int *)(this + lVar1 + 8) == *(int *)((long)&(*expected)[0].length + lVar1))) &&
         (*(int *)(this + lVar1 + 0xc) == *(int *)((long)&(*expected)[0].cover + lVar1)))) {
    lVar1 = lVar1 + 0x10;
    if (lVar1 == 0x70) {
      return;
    }
  }
  pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Value is not \'true\'!","");
  FailedAssertion::FailedAssertion(pFVar2,&local_40,location);
  __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}